

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primvar.hh
# Opt level: O3

bool __thiscall tinyusdz::primvar::PrimVar::is_scalar(PrimVar *this)

{
  vtable_type *pvVar1;
  uint32_t uVar2;
  
  if (((this->_blocked == false) &&
      (pvVar1 = (this->_value).v_.vtable, pvVar1 != (vtable_type *)0x0)) &&
     ((uVar2 = (*pvVar1->type_id)(), uVar2 == 0 ||
      ((pvVar1 = (this->_value).v_.vtable, pvVar1 != (vtable_type *)0x0 &&
       (uVar2 = (*pvVar1->type_id)(), uVar2 == 1)))))) {
    return false;
  }
  return (this->_ts)._samples.
         super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
         ._M_impl.super__Vector_impl_data._M_start ==
         (this->_ts)._samples.
         super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
         ._M_impl.super__Vector_impl_data._M_finish;
}

Assistant:

bool is_scalar() const {
    return has_value() && _ts.empty();
  }